

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd.c
# Opt level: O2

int strlen16(unsigned_short *s)

{
  long lVar1;
  
  for (lVar1 = 0; s[lVar1] != 0; lVar1 = lVar1 + 1) {
  }
  return (int)lVar1;
}

Assistant:

static int
strlen16 (unsigned short *s)
{
	int len = 0;
	while (*s) {
		s++;
		len++;
	}
	return len;
}